

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.h
# Opt level: O2

void __thiscall L15_4::LabeledSales::~LabeledSales(LabeledSales *this)

{
  ~LabeledSales(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~LabeledSales() {}